

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

bool __thiscall
testing::
PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&>::MatchAndExplain
          (MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this,
          vector<char,_std::allocator<char>_> *x,MatchResultListener *listener)

{
  ulong __n;
  pointer __s2;
  int iVar1;
  
  __n = (this->impl_).predicate_.expected_._M_string_length;
  __s2 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  if (__n <= (ulong)((long)(x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)__s2)) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((this->impl_).predicate_.expected_._M_dataplus._M_p,__s2,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  MatchResultListener::operator<<(listener,(char (*) [35])"didn\'t satisfy the given predicate");
  return false;
}

Assistant:

bool MatchAndExplain(T x, MatchResultListener* listener) const override {
      return impl_.MatchAndExplain(x, listener);
    }